

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void getSystemBasePath(char *path,uint pathLength,uint *subLength)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  if (subLength != (uint *)0x0 && path == (char *)0x0) {
    *subLength = 0;
  }
  if (path != (char *)0x0) {
    pcVar4 = path + ((ulong)pathLength - 1);
    uVar2 = 0;
    bVar8 = false;
    do {
      pcVar1 = getSystemBasePath::systemPaths[uVar2];
      pcVar3 = pcVar1 + ((ulong)"\t\v\x0f\x11"[uVar2 >> 1 & 0x7fffffff] - 1);
      pcVar5 = pcVar4;
      pcVar7 = pcVar3;
      pcVar6 = pcVar3;
      if (pcVar1 <= pcVar3 && path <= pcVar4) {
        do {
          pcVar7 = pcVar3;
          if (*pcVar5 == *pcVar6) {
            pcVar7 = pcVar6 + -1;
          }
          pcVar5 = pcVar5 + -1;
        } while ((pcVar1 <= pcVar7) && (pcVar6 = pcVar7, path <= pcVar5));
      }
      if (pcVar7 < pcVar1) {
        *subLength = (uint)"\x05\v"[uVar2 >> 2 & 0x3fffffff] + ((int)pcVar5 - (int)path) + 1;
        if (!bVar8) {
          return;
        }
        break;
      }
      bVar8 = 6 < uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 8);
    *subLength = 0;
  }
  return;
}

Assistant:

void getSystemBasePath(const char * path, unsigned int pathLength, unsigned int * subLength)
{
    static const char * systemPaths[] = {
        "/usr/bin/",
        "/usr/lib/",
        "/usr/lib32/",
        "/usr/lib64/",
        "/usr/local/bin/",
        "/usr/local/lib/",
        "/usr/local/lib32/",
        "/usr/local/lib64/",
    };
    static unsigned char systemPathLengths[] = { 9, 11, 15, 17 };
    static unsigned char systemPathPrefixLength[] = { 5, 11 };

    if (!checkStringParameter(path, subLength))
    {
        return;
    }

    for (int i = 0; i < 8; ++i)
    {
        const char * systemPath = systemPaths[i];
        unsigned char systemPathLength = systemPathLengths[i >> 1];

        const char * iter = path + pathLength - 1;
        const char * resetSearchIter = systemPath + systemPathLength - 1;
        const char * searchIter = resetSearchIter;
        while (searchIter >= systemPath && iter >= path)
        {
            searchIter = *iter == *searchIter ? searchIter - 1 : resetSearchIter;
            --iter;
        }

        if (searchIter < systemPath) // sub-systemPath-string found
        {
            *subLength = (unsigned int)(iter - path) + systemPathPrefixLength[i >> 2] + 1;
            return;
        }
    }

    *subLength = 0;
}